

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::ensure_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  CVmHashEntry *pCVar1;
  undefined4 in_ESI;
  size_t in_RDI;
  CVmHashEntryPLI *entry;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  pCVar1 = CVmHashTable::find((CVmHashTable *)CONCAT44(obj,in_stack_00000008),(char *)entry,in_RDI);
  if (pCVar1 != (CVmHashEntry *)0x0) {
    call_post_load_init((CVmHashEntryPLI *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void CVmObjTable::ensure_post_load_init(VMG_ vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* find the entry */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));

    /* if we found it, invoke its initialization method */
    if (entry != 0)
        call_post_load_init(vmg_ entry);
}